

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10>::~TPZManVector
          (TPZManVector<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>,_10> *this)

{
  undefined8 *in_RDI;
  TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *unaff_retaddr;
  undefined8 *local_18;
  
  *in_RDI = &PTR__TPZManVector_024bb430;
  if ((undefined8 *)in_RDI[1] == in_RDI + 4) {
    in_RDI[1] = 0;
  }
  in_RDI[3] = 0;
  local_18 = in_RDI + 0x2c;
  do {
    local_18 = local_18 + -4;
    std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::~function
              ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x19ec61e);
  } while (local_18 != in_RDI + 4);
  TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::~TPZVec(unaff_retaddr);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}